

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

TypedExpectation<long_long_()> * __thiscall
testing::internal::FunctionMockerBase<long_long_()>::FindMatchingExpectationLocked
          (FunctionMockerBase<long_long_()> *this,ArgumentTuple *args)

{
  TypedExpectation<long_long_()> *this_00;
  bool bVar1;
  __normal_iterator<const_testing::internal::linked_ptr<testing::internal::ExpectationBase>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>_>
  __tmp;
  pointer plVar2;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  plVar2 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (plVar2 == (this->super_UntypedFunctionMockerBase).untyped_expectations_.
                  super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return (TypedExpectation<long_long_()> *)0x0;
    }
    this_00 = (TypedExpectation<long_long_()> *)plVar2[-1].value_;
    plVar2 = plVar2 + -1;
    bVar1 = TypedExpectation<long_long_()>::ShouldHandleArguments(this_00,args);
  } while (!bVar1);
  return this_00;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    for (typename UntypedExpectations::const_reverse_iterator it =
             untyped_expectations_.rbegin();
         it != untyped_expectations_.rend(); ++it) {
      TypedExpectation<F>* const exp =
          static_cast<TypedExpectation<F>*>(it->get());
      if (exp->ShouldHandleArguments(args)) {
        return exp;
      }
    }
    return NULL;
  }